

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

MemberIterator __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
DoFindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *name)

{
  bool bVar1;
  ulong uVar2;
  MemberIterator rhs;
  
  uVar2 = *(ulong *)(this + 8);
  rhs = (MemberIterator)(uVar2 & 0xffffffffffff);
  while( true ) {
    if (rhs == (MemberIterator)((ulong)*(uint *)this * 0x20 + (uVar2 & 0xffffffffffff))) {
      return rhs;
    }
    bVar1 = StringEqual<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)name,&rhs->name);
    if (bVar1) break;
    rhs = rhs + 1;
    uVar2 = *(ulong *)(this + 8);
  }
  return rhs;
}

Assistant:

MemberIterator DoFindMember(const GenericValue<Encoding, SourceAllocator>& name) {
        MemberIterator member = MemberBegin();
        for ( ; member != MemberEnd(); ++member)
            if (name.StringEqual(member->name))
                break;
        return member;
    }